

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_ult(lua_State *L)

{
  ulong uVar1;
  ulong uVar2;
  lua_Integer b;
  lua_Integer a;
  lua_State *L_local;
  
  uVar1 = luaL_checkinteger(L,1);
  uVar2 = luaL_checkinteger(L,2);
  lua_pushboolean(L,(uint)(uVar1 < uVar2));
  return 1;
}

Assistant:

static int math_ult (lua_State *L) {
  lua_Integer a = luaL_checkinteger(L, 1);
  lua_Integer b = luaL_checkinteger(L, 2);
  lua_pushboolean(L, (lua_Unsigned)a < (lua_Unsigned)b);
  return 1;
}